

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O2

void anon_unknown.dwarf_18e6ac::readBadBoundsImage(char *fileName)

{
  int iVar1;
  ostream *poVar2;
  RgbaInputFile in;
  RgbaInputFile local_50 [64];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"file ");
  poVar2 = std::operator<<(poVar2,fileName);
  std::operator<<(poVar2," ");
  std::ostream::flush();
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_50,fileName,iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"version ");
  iVar1 = Imf_3_2::RgbaInputFile::version();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," ");
  std::ostream::flush();
  Imf_3_2::RgbaInputFile::~RgbaInputFile(local_50);
  return;
}

Assistant:

void
readBadBoundsImage (const char fileName[])
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    //const Box2i &dw = in.dataWindow();
}